

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

void Node_AddNotify(node *Node,dataid Id,notifyproc Func,void *Referer)

{
  long lVar1;
  undefined8 *puVar2;
  nodedata *pnVar3;
  nodedata *pnVar4;
  nodenotify Origin;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  if (Node != (node *)0x0) {
    lVar1 = *Node->VMT;
    pnVar4 = (nodedata *)&Node->Data;
    pnVar3 = (nodedata *)0x0;
    do {
      pnVar4 = pnVar4->Next;
      if (pnVar4 == (nodedata *)0x0) goto LAB_00129109;
    } while (pnVar4->Code != (Id << 8 | 0xe));
    pnVar3 = pnVar4 + 1;
LAB_00129109:
    if (pnVar3 == (nodedata *)0x0) {
      local_38 = 0;
      uStack_30 = 0;
      local_28 = 0;
      pnVar3 = (nodedata *)Node_AddData(Node,Id,0xe,&local_38);
      if (pnVar3 == (nodedata *)0x0) {
        return;
      }
    }
    puVar2 = *(undefined8 **)(lVar1 + 0x80);
    pnVar4 = (nodedata *)(*(code *)*puVar2)(puVar2,0x18);
    if (pnVar4 != (nodedata *)0x0) {
      pnVar4->Code = (size_t)Func;
      pnVar4[1].Next = (nodedata *)Referer;
      pnVar4->Next = pnVar3->Next;
      pnVar3->Next = pnVar4;
    }
  }
  return;
}

Assistant:

NOINLINE void Node_AddNotify(node* Node, dataid Id, notifyproc Func, void* Referer)
{
    if (Node)
    {
        nodecontext* p = Node_Context(Node);
        nodenotify* n;
        nodenotify* Ptr;

        Ptr = Node_GetData(Node,Id,TYPE_NODENOTIFY);
        if (!Ptr)
        {
            nodenotify Origin = {NULL,NULL,NULL};
            Ptr = Node_AddData(Node,Id,TYPE_NODENOTIFY,&Origin);
            if (!Ptr)
            {
                // Something went wrong ! No more memory ?
                return;
            }
        }

        n = MemHeap_Alloc(p->NodeHeap,sizeof(nodenotify));
        if (!n)
        {
            return;
        }

        n->Func = Func;
        n->Referer = Referer;
        n->Next = Ptr->Next;
        Ptr->Next = n;
    }
}